

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_CALL(Context *ctx)

{
  char local_58 [8];
  char labelstr [64];
  Context *ctx_local;
  
  if (ctx->profile_supports_nv2 == 0) {
    failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  }
  else {
    get_ARB1_srcarg_varname(ctx,0,local_58,0x40);
    output_line(ctx,"CAL %s;",local_58);
  }
  return;
}

Assistant:

static void emit_ARB1_CALL(Context *ctx)
{
    if (!support_nv2(ctx))  // no branching in stock ARB1.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
        return;
    } // if

    char labelstr[64];
    get_ARB1_srcarg_varname(ctx, 0, labelstr, sizeof (labelstr));
    output_line(ctx, "CAL %s;", labelstr);
}